

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall fizplex::ColMatrix_SwapColumns_Test::TestBody(ColMatrix_SwapColumns_Test *this)

{
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  bool bVar1;
  SVector *lhs;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SVector v2;
  SVector v0;
  ColMatrix m;
  SVector *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  SVector *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  ColMatrix *in_stack_fffffffffffffde0;
  SVector *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  iterator in_stack_fffffffffffffe08;
  size_type in_stack_fffffffffffffe10;
  undefined8 **local_1d0;
  AssertHelper local_1c8;
  Message local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  AssertionResult local_198 [4];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined1 **local_90;
  undefined8 *local_88 [3];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined1 **local_40;
  undefined8 local_38;
  
  local_90 = (undefined1 **)local_88;
  local_b8 = 2;
  uStack_b0 = 0xc008000000000000;
  local_c8 = 0;
  uStack_c0 = 0x401c000000000000;
  local_a0 = &local_c8;
  local_98 = 2;
  l._M_len._0_7_ = in_stack_fffffffffffffe00;
  l._M_array = (iterator)in_stack_fffffffffffffdf8;
  l._M_len._7_1_ = in_stack_fffffffffffffe07;
  SVector::SVector(in_stack_fffffffffffffdf0,l);
  local_90 = (undefined1 **)local_70;
  local_f8 = 2;
  uStack_f0 = 0x4010000000000000;
  local_108 = 1;
  uStack_100 = 0x4008000000000000;
  local_118 = 0;
  uStack_110 = 0x4000000000000000;
  local_e8 = &local_118;
  local_e0 = 3;
  l_00._M_len._0_7_ = in_stack_fffffffffffffe00;
  l_00._M_array = (iterator)in_stack_fffffffffffffdf8;
  l_00._M_len._7_1_ = in_stack_fffffffffffffe07;
  SVector::SVector(in_stack_fffffffffffffdf0,l_00);
  local_90 = (undefined1 **)local_58;
  local_138 = 2;
  uStack_130 = 0xc000000000000000;
  local_148 = 1;
  uStack_140 = 0xbff0000000000000;
  local_158 = 0;
  uStack_150 = 0x3ff0000000000000;
  local_128 = &local_158;
  local_120 = 3;
  l_01._M_len._0_7_ = in_stack_fffffffffffffe00;
  l_01._M_array = (iterator)in_stack_fffffffffffffdf8;
  l_01._M_len._7_1_ = in_stack_fffffffffffffe07;
  SVector::SVector(in_stack_fffffffffffffdf0,l_01);
  local_40 = (undefined1 **)local_88;
  local_38 = 3;
  colList._M_len = in_stack_fffffffffffffe10;
  colList._M_array = in_stack_fffffffffffffe08;
  ColMatrix::ColMatrix
            ((ColMatrix *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0,colList);
  local_1d0 = &local_40;
  do {
    local_1d0 = local_1d0 + -3;
    SVector::~SVector((SVector *)0x1bb58c);
  } while (local_1d0 != local_88);
  ColMatrix::column((ColMatrix *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                    (size_t)in_stack_fffffffffffffdb8);
  SVector::SVector((SVector *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8);
  ColMatrix::column((ColMatrix *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                    (size_t)in_stack_fffffffffffffdb8);
  SVector::SVector((SVector *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8);
  ColMatrix::swap_columns
            (in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
             (size_t)in_stack_fffffffffffffdd0);
  ColMatrix::column((ColMatrix *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                    (size_t)in_stack_fffffffffffffdb8);
  testing::internal::EqHelper<false>::Compare<fizplex::SVector,fizplex::SVector>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (SVector *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    in_stack_fffffffffffffdd0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1bb7ab);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x54,in_stack_fffffffffffffdd0);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x1bb808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bb85d);
  lhs = ColMatrix::column((ColMatrix *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                          ,(size_t)in_stack_fffffffffffffdb8);
  testing::internal::EqHelper<false>::Compare<fizplex::SVector,fizplex::SVector>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,lhs,
             (SVector *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1bb909);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message((Message *)0x1bb964);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bb9b9);
  SVector::~SVector((SVector *)0x1bb9c6);
  SVector::~SVector((SVector *)0x1bb9d3);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bb9e0);
  return;
}

Assistant:

TEST(ColMatrix, SwapColumns) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector v0 = m.column(0);
  const SVector v2 = m.column(2);
  m.swap_columns(0, 2);
  EXPECT_EQ(v2, m.column(0));
  EXPECT_EQ(v0, m.column(2));
}